

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

cmListFileBacktrace __thiscall
cmListFileBacktrace::Push(cmListFileBacktrace *this,cmListFileContext *lfc)

{
  bool bVar1;
  element_type *peVar2;
  cmListFileContext *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  cmListFileBacktrace cVar4;
  bool local_59;
  shared_ptr<const_cmListFileBacktrace::Entry> local_30;
  cmListFileContext *local_20;
  cmListFileContext *lfc_local;
  cmListFileBacktrace *this_local;
  
  local_20 = in_RDX;
  lfc_local = lfc;
  this_local = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)lfc);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)lfc);
    bVar1 = Entry::IsBottom(peVar2);
    local_59 = true;
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)lfc);
      local_59 = cmStateSnapshot::IsValid((cmStateSnapshot *)peVar2);
    }
    if (local_59 == false) {
      __assert_fail("!this->TopEntry->IsBottom() || this->TopEntry->Bottom.IsValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListFileCache.cxx"
                    ,0x17a,
                    "cmListFileBacktrace cmListFileBacktrace::Push(const cmListFileContext &) const"
                   );
    }
    std::shared_ptr<const_cmListFileBacktrace::Entry>::shared_ptr
              (&local_30,(shared_ptr<const_cmListFileBacktrace::Entry> *)lfc);
    cmListFileBacktrace(this,&local_30,local_20);
    std::shared_ptr<const_cmListFileBacktrace::Entry>::~shared_ptr(&local_30);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    cmListFileBacktrace(this,(cmListFileBacktrace *)lfc);
    _Var3._M_pi = extraout_RDX;
  }
  cVar4.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  cVar4.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (cmListFileBacktrace)
         cVar4.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmListFileBacktrace cmListFileBacktrace::Push(
  cmListFileContext const& lfc) const
{
  if (!this->TopEntry)
    return *this;
  // assert(this->TopEntry);
  assert(!this->TopEntry->IsBottom() || this->TopEntry->Bottom.IsValid());
  return cmListFileBacktrace(this->TopEntry, lfc);
}